

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void __thiscall
FConsoleAlias::FConsoleAlias(FConsoleAlias *this,char *name,char *command,bool noSave)

{
  char *pcVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  FString local_30;
  
  uVar2 = CONCAT71(in_register_00000009,noSave) & 0xffffffff;
  FConsoleCommand::FConsoleCommand(&this->super_FConsoleCommand,name,(CCmdRun)0x0);
  (this->super_FConsoleCommand)._vptr_FConsoleCommand = (_func_int **)&PTR__FConsoleAlias_0086c638;
  this->m_Command[0].Chars = FString::NullString.Nothing;
  this->m_Command[1].Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  this->bRunning = false;
  this->bKill = false;
  FString::operator=(this->m_Command + uVar2,command);
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_30.Chars = FString::NullString.Nothing;
  FString::operator=(this->m_Command + (byte)((byte)uVar2 ^ 1),&local_30);
  FString::~FString(&local_30);
  pcVar1 = strchr(command,0x25);
  this->bDoSubstitution = pcVar1 != (char *)0x0;
  return;
}

Assistant:

FConsoleAlias::FConsoleAlias (const char *name, const char *command, bool noSave)
	: FConsoleCommand (name, NULL),
	  bRunning(false), bKill(false)
{
	m_Command[noSave] = command;
	m_Command[!noSave] = FString();
	// If the command contains % characters, assume they are parameter markers
	// for substitution when the command is executed.
	bDoSubstitution = (strchr (command, '%') != NULL);
}